

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_schema.c
# Opt level: O0

reflection_Type_ref_t export_type(flatcc_builder_t *B,fb_value_t type)

{
  ushort uVar1;
  undefined4 uVar2;
  reflection_Type_ref_t rVar3;
  uint16_t local_1e;
  reflection_BaseType_enum_t local_1b;
  char local_1a;
  char local_19;
  int32_t iStack_18;
  uint16_t fixed_length;
  reflection_BaseType_enum_t primitive;
  reflection_BaseType_enum_t element;
  fb_scalar_type_t fStack_14;
  reflection_BaseType_enum_t base_type;
  int32_t index;
  fb_scalar_type_t st;
  flatcc_builder_t *B_local;
  
  fStack_14 = fb_missing_type;
  iStack_18 = -1;
  local_19 = '\0';
  local_1a = '\0';
  local_1b = '\0';
  local_1e = 0;
  uVar2 = type.field_0.st;
  switch(type.type) {
  case 8:
    fStack_14 = uVar2;
    local_19 = '\x0e';
    break;
  case 9:
    fStack_14 = uVar2;
    break;
  case 10:
    local_1a = '\r';
    local_19 = '\x0e';
    break;
  case 0xb:
    local_19 = '\r';
    break;
  default:
    break;
  case 0xf:
    iStack_18 = (int32_t)(type.field_0.ct)->export_index;
    uVar1 = (type.field_0.ref)->kind;
    if (uVar1 < 2) {
      local_19 = '\x0f';
    }
    else if (uVar1 == 3) {
      fStack_14 = ((type.field_0.ct)->type).field_0.st;
    }
    else if (uVar1 == 4) {
      local_19 = '\x10';
    }
    else {
      iStack_18 = -1;
    }
    break;
  case 0x10:
    iStack_18 = (int32_t)(type.field_0.ct)->export_index;
    uVar1 = (type.field_0.ref)->kind;
    if (uVar1 < 2) {
      local_19 = '\x0e';
      local_1a = '\x0f';
    }
    else if (uVar1 == 3) {
      fStack_14 = ((type.field_0.ct)->type).field_0.st;
      local_19 = '\x0e';
    }
    else if (uVar1 == 4) {
      local_19 = '\x0e';
      local_1a = '\x10';
    }
    break;
  case 0x11:
    fStack_14 = uVar2;
    local_19 = '\x11';
    local_1e = (uint16_t)type.len;
    break;
  case 0x13:
    break;
  case 0x14:
    iStack_18 = (int32_t)(type.field_0.ct)->export_index;
    uVar1 = (type.field_0.ref)->kind;
    if (uVar1 < 2) {
      local_1a = '\x0f';
    }
    else if (uVar1 == 3) {
      fStack_14 = ((type.field_0.ct)->type).field_0.st;
    }
    else if (uVar1 == 4) {
      local_1a = '\x10';
    }
    local_19 = '\x11';
    local_1e = (uint16_t)type.len;
  }
  switch(fStack_14) {
  case fb_missing_type:
    break;
  case fb_ulong:
    local_1b = '\n';
    break;
  case fb_uint:
    local_1b = '\b';
    break;
  case fb_ushort:
    local_1b = '\x06';
    break;
  case fb_ubyte:
    local_1b = '\x04';
    break;
  case fb_bool:
    local_1b = '\x02';
    break;
  case fb_long:
    local_1b = '\t';
    break;
  case fb_int:
    local_1b = '\a';
    break;
  case fb_short:
    local_1b = '\x05';
    break;
  case fb_byte:
    local_1b = '\x03';
    break;
  case fb_double:
    local_1b = '\f';
    break;
  case fb_float:
    local_1b = '\v';
    break;
  case fb_char:
    local_1b = '\x03';
  }
  if (local_19 == '\0') {
    local_19 = local_1b;
  }
  else if (((local_19 == '\x0e') || (local_19 == '\x11')) && (local_1a == '\0')) {
    local_1a = local_1b;
  }
  rVar3 = reflection_Type_create(B,local_19,local_1a,iStack_18,local_1e);
  return rVar3;
}

Assistant:

static reflection_Type_ref_t export_type(flatcc_builder_t *B, fb_value_t type)
{
    fb_scalar_type_t st = fb_missing_type;
    int32_t index = -1;
    reflection_BaseType_enum_t base_type = BaseType(None);
    reflection_BaseType_enum_t element = BaseType(None);
    reflection_BaseType_enum_t primitive = BaseType(None);
    uint16_t fixed_length = 0;

    switch (type.type) {
    case vt_scalar_type:
        st = type.st;
        break;
    case vt_vector_type:
        st = type.st;
        base_type = BaseType(Vector);
        break;
    case vt_vector_string_type:
        element = BaseType(String);
        base_type = BaseType(Vector);
        break;
    case vt_vector_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            base_type = BaseType(Vector);
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Vector);
            element = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Vector);
            element = BaseType(Union);
            break;
        default:
            break;
        }
        break;
    case vt_string_type:
        base_type = BaseType(String);
        break;
    case vt_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Union);
            break;
        default:
            index = -1;
            break;
        }
        break;
    case vt_fixed_array_type:
        st = type.st;
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_string_type:
        break;
        element = BaseType(Byte);
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            element = BaseType(Obj);
            break;
        case fb_is_union:
            element = BaseType(Union);
            break;
        default:
            break;
        }
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    default:
        break;
    }
    /* If st is set, resolve scalar type and set it to base_type or element. */
    switch (st) {
    case fb_missing_type: break;
    case fb_ulong: primitive = BaseType(ULong); break;
    case fb_uint: primitive = BaseType(UInt); break;
    case fb_ushort: primitive = BaseType(UShort); break;
    case fb_ubyte: primitive = BaseType(UByte); break;
    case fb_bool: primitive = BaseType(Bool); break;
    case fb_long: primitive = BaseType(Long); break;
    case fb_int: primitive = BaseType(Int); break;
    case fb_short: primitive = BaseType(Short); break;
    case fb_byte: primitive = BaseType(Byte); break;
    case fb_double: primitive = BaseType(Double); break;
    case fb_float: primitive = BaseType(Float); break;
    /* TODO: Googles flatc tool does not have char arrays so we use Byte as element type */
    case fb_char: primitive = BaseType(Byte); break;
    default: break;
    }

    if (base_type == BaseType(None)) {
        base_type = primitive;
    } else if (base_type == BaseType(Vector) || base_type == BaseType(Array)) {
        if (element == BaseType(None)) {
            element = primitive;
        }
    }
    return reflection_Type_create(B, base_type, element, index, fixed_length);
}